

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void body(LexState *ls,expdesc *e,int ismethod,int line)

{
  TString *name;
  undefined1 local_88 [8];
  BlockCnt bl;
  FuncState new_fs;
  int line_local;
  int ismethod_local;
  expdesc *e_local;
  LexState *ls_local;
  
  bl._16_8_ = addprototype(ls);
  ((Proto *)bl._16_8_)->linedefined = line;
  open_func(ls,(FuncState *)&bl.nactvar,(BlockCnt *)local_88);
  checknext(ls,0x28);
  if (ismethod != 0) {
    name = luaX_newstring(ls,"self",4);
    new_localvar(ls,name);
    adjustlocalvars(ls,1);
  }
  parlist(ls);
  checknext(ls,0x29);
  statlist(ls);
  *(int *)(bl._16_8_ + 0x30) = ls->linenumber;
  check_match(ls,0x105,0x108,line);
  codeclosure(ls,e);
  close_func(ls);
  return;
}

Assistant:

static void body (LexState *ls, expdesc *e, int ismethod, int line) {
  /* body ->  '(' parlist ')' block END */
  FuncState new_fs;
  BlockCnt bl;
  new_fs.f = addprototype(ls);
  new_fs.f->linedefined = line;
  open_func(ls, &new_fs, &bl);
  checknext(ls, '(');
  if (ismethod) {
    new_localvarliteral(ls, "self");  /* create 'self' parameter */
    adjustlocalvars(ls, 1);
  }
  parlist(ls);
  checknext(ls, ')');
  statlist(ls);
  new_fs.f->lastlinedefined = ls->linenumber;
  check_match(ls, TK_END, TK_FUNCTION, line);
  codeclosure(ls, e);
  close_func(ls);
}